

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryEffectsLoader.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL::LibraryEffectsLoader::begin__common_float_or_param_type____float
          (LibraryEffectsLoader *this,
          common_float_or_param_type____float__AttributeData *attributeData)

{
  size_t sVar1;
  long lVar2;
  Animatable *target;
  char *colladaSid;
  EffectCommon **ppEVar3;
  
  switch(this->mCurrentShaderParameterType) {
  case SHADER_PARAMETER_SHININESS:
    colladaSid = attributeData->sid;
    ppEVar3 = (this->mCurrentEffect->mCommonEffects).
              super_ArrayPrimitiveType<COLLADAFW::EffectCommon_*>.mData;
    sVar1 = (this->mCurrentEffect->mCommonEffects).
            super_ArrayPrimitiveType<COLLADAFW::EffectCommon_*>.mCount;
    lVar2 = 0x310;
    break;
  default:
    goto switchD_007bf043_caseD_5;
  case SHADER_PARAMETER_REFLECTIVITY:
    colladaSid = attributeData->sid;
    ppEVar3 = (this->mCurrentEffect->mCommonEffects).
              super_ArrayPrimitiveType<COLLADAFW::EffectCommon_*>.mData;
    sVar1 = (this->mCurrentEffect->mCommonEffects).
            super_ArrayPrimitiveType<COLLADAFW::EffectCommon_*>.mCount;
    lVar2 = 0x460;
    break;
  case SHADER_PARAMETER_TRANSPARENCY:
    colladaSid = attributeData->sid;
    target = &(this->mTransparency).super_Animatable;
    goto LAB_007bf096;
  case SHADER_PARAMETER_INDEX_OF_REFRACTION:
    colladaSid = attributeData->sid;
    ppEVar3 = (this->mCurrentEffect->mCommonEffects).
              super_ArrayPrimitiveType<COLLADAFW::EffectCommon_*>.mData;
    sVar1 = (this->mCurrentEffect->mCommonEffects).
            super_ArrayPrimitiveType<COLLADAFW::EffectCommon_*>.mCount;
    lVar2 = 0x700;
  }
  target = (Animatable *)((long)&ppEVar3[sVar1 - 1]->_vptr_EffectCommon + lVar2);
LAB_007bf096:
  IFilePartLoader::addToSidTree((IFilePartLoader *)this,(char *)0x0,colladaSid,target);
switchD_007bf043_caseD_5:
  return true;
}

Assistant:

bool LibraryEffectsLoader::begin__common_float_or_param_type____float ( const common_float_or_param_type____float__AttributeData& attributeData )
    {
        switch ( mCurrentShaderParameterType)
        {
        case SHADER_PARAMETER_SHININESS:
            addToSidTree( 0, attributeData.sid, &mCurrentEffect->getCommonEffects().back()->getShininess() );
            break;
        case SHADER_PARAMETER_REFLECTIVITY:
            addToSidTree( 0, attributeData.sid, &mCurrentEffect->getCommonEffects().back()->getReflectivity() );
            break;
        case SHADER_PARAMETER_INDEX_OF_REFRACTION:
            addToSidTree( 0, attributeData.sid, &mCurrentEffect->getCommonEffects().back()->getIndexOfRefraction() );
            break;
        case SHADER_PARAMETER_TRANSPARENCY:
            addToSidTree( 0, attributeData.sid, &mTransparency );
            break;
        default:
            break;
        }      
        return true;
    }